

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void __thiscall ON_Brep::ON_Brep(ON_Brep *this)

{
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081ef18;
  ON_CurveArray::ON_CurveArray(&this->m_C2,0);
  ON_CurveArray::ON_CurveArray(&this->m_C3,0);
  ON_SurfaceArray::ON_SurfaceArray(&this->m_S,0);
  ON_BrepVertexArray::ON_BrepVertexArray(&this->m_V);
  ON_BrepEdgeArray::ON_BrepEdgeArray(&this->m_E);
  ON_BrepTrimArray::ON_BrepTrimArray(&this->m_T);
  ON_BrepLoopArray::ON_BrepLoopArray(&this->m_L);
  ON_BrepFaceArray::ON_BrepFaceArray(&this->m_F);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_region_topology = (ON_BrepRegionTopology *)0x0;
  (this->m_aggregate_status).m_aggregate_status = ON_ComponentStatus::NoneSet;
  *(undefined8 *)((long)&(this->m_aggregate_status).m_highlighted_count + 2) = 0;
  *(undefined8 *)((long)&(this->m_aggregate_status).m_locked_count + 2) = 0;
  *(undefined4 *)((long)&this->m_is_solid + 1) = 0;
  *(undefined8 *)&(this->m_aggregate_status).m_current = 0;
  *(undefined8 *)((long)&(this->m_aggregate_status).m_selected_count + 2) = 0;
  if (m_s_ON_Brep_ptr != (void *)0x0) {
    (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)m_s_ON_Brep_ptr;
  }
  Initialize(this);
  return;
}

Assistant:

ON_Brep::ON_Brep()
{ 
  ON__SET__THIS__PTR(m_s_ON_Brep_ptr);
  Initialize();

  /*
  const size_t sz = sizeof(*this);
  const char* p0 = (char*)(this);
  const char* p1 = (char*)(&m_bbox);
  const char* p2 = (char*)(&m_region_topology);
  const char* p3 = (char*)(&m_aggregate_status);
  const char* p4 = (char*)(&m_is_solid);
  const char* p5 = (char*)(&m_sleep_lock);
  const char* p100 = (char*)(this+1);

  const size_t offset1 = (p1 - p0);
  const size_t offset2 = (p2 - p0);
  const size_t offset3 = (p3 - p0);
  const size_t offset4 = (p4 - p0);
  const size_t offset5 = (p5 - p0);
  const size_t offset100 = (p100 - p0);
  ON_TextLog::Null.Print(L"", sz, offset1, offset2, offset3, offset4, offset5, offset100);

  //BEFORE:
  //  offset1	216
  //  offset2	264
  //  offset3	272
  //  offset4	304
  //  offset5	308
  //  offset100	312
  //  sz	312

  //  AFTER
  //  ...
  */
}